

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O1

void __thiscall JUnitTestOutputTestRunner::runPreviousTest(JUnitTestOutputTestRunner *this)

{
  uint uVar1;
  
  if (this->currentTest_ != (UtestShell *)0x0) {
    if (this->firstTestInGroup_ == true) {
      TestResult::currentGroupStarted(&this->result_,this->currentTest_);
      this->firstTestInGroup_ = false;
    }
    TestResult::currentTestStarted(&this->result_,this->currentTest_);
    millisTime = millisTime + this->timeTheTestTakes_;
    if (this->numberOfChecksInTest_ != 0) {
      uVar1 = 0;
      do {
        TestResult::countCheck(&this->result_);
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->numberOfChecksInTest_);
    }
    this->numberOfChecksInTest_ = 0;
    if (this->testFailure_ != (TestFailure *)0x0) {
      TestResult::addFailure(&this->result_,this->testFailure_);
      if (this->testFailure_ != (TestFailure *)0x0) {
        (*this->testFailure_->_vptr_TestFailure[1])();
      }
      this->testFailure_ = (TestFailure *)0x0;
    }
    TestResult::currentTestEnded(&this->result_,this->currentTest_);
    return;
  }
  return;
}

Assistant:

void runPreviousTest()
    {
        if (currentTest_ == NULLPTR) return;

        if (firstTestInGroup_) {
            result_.currentGroupStarted(currentTest_);
            firstTestInGroup_ = false;
        }
        result_.currentTestStarted(currentTest_);

        millisTime += timeTheTestTakes_;
        for(unsigned int i = 0; i < numberOfChecksInTest_; i++) {
            result_.countCheck();
        }
        numberOfChecksInTest_ = 0;

        if (testFailure_) {
            result_.addFailure(*testFailure_);
            delete testFailure_;
            testFailure_ = NULLPTR;
        }

        result_.currentTestEnded(currentTest_);
    }